

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator_1D_mri.c
# Opt level: O0

int fs(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  long lVar2;
  int iVar3;
  double *pdVar4;
  double *returnvalue;
  long *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  double dVar5;
  sunindextype i;
  sunrealtype tmp;
  sunrealtype *dYdata;
  sunrealtype *Ydata;
  sunrealtype dx;
  sunrealtype c;
  sunindextype N;
  UserData udata;
  undefined8 in_stack_ffffffffffffff98;
  int opt;
  long lVar6;
  char *in_stack_ffffffffffffffa0;
  void *returnvalue_00;
  int local_4;
  
  lVar2 = *in_RDX;
  dVar1 = (double)in_RDX[4];
  dVar5 = (double)in_RDX[1];
  returnvalue_00 = (void *)0x0;
  pdVar4 = (double *)N_VGetArrayPointer(in_RDI);
  opt = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  iVar3 = check_retval(returnvalue_00,in_stack_ffffffffffffffa0,opt);
  if (iVar3 == 0) {
    returnvalue = (double *)N_VGetArrayPointer(in_RSI);
    iVar3 = check_retval(returnvalue,in_stack_ffffffffffffffa0,opt);
    if (iVar3 == 0) {
      dVar5 = -dVar1 / dVar5;
      if (dVar1 <= 0.0) {
        if (dVar1 < 0.0) {
          for (lVar6 = 0; lVar6 < lVar2 + -1; lVar6 = lVar6 + 1) {
            returnvalue[lVar6 * 3] = dVar5 * (pdVar4[(lVar6 + 1) * 3] - pdVar4[lVar6 * 3]);
            returnvalue[lVar6 * 3 + 1] =
                 dVar5 * (pdVar4[(lVar6 + 1) * 3 + 1] - pdVar4[lVar6 * 3 + 1]);
            returnvalue[lVar6 * 3 + 2] =
                 dVar5 * (pdVar4[(lVar6 + 1) * 3 + 2] - pdVar4[lVar6 * 3 + 2]);
          }
          returnvalue[(lVar2 + -1) * 3] = dVar5 * (pdVar4[(lVar2 + -1) * 3] - *pdVar4);
          returnvalue[(lVar2 + -1) * 3 + 1] = dVar5 * (pdVar4[(lVar2 + -1) * 3 + 1] - pdVar4[1]);
          returnvalue[(lVar2 + -1) * 3 + 2] = dVar5 * (pdVar4[(lVar2 + -1) * 3 + 2] - pdVar4[2]);
        }
      }
      else {
        *returnvalue = dVar5 * (*pdVar4 - pdVar4[(lVar2 + -1) * 3]);
        returnvalue[1] = dVar5 * (pdVar4[1] - pdVar4[(lVar2 + -1) * 3 + 1]);
        returnvalue[2] = dVar5 * (pdVar4[2] - pdVar4[(lVar2 + -1) * 3 + 2]);
        for (lVar6 = 1; lVar6 < lVar2; lVar6 = lVar6 + 1) {
          returnvalue[lVar6 * 3] = dVar5 * (pdVar4[lVar6 * 3] - pdVar4[(lVar6 + -1) * 3]);
          returnvalue[lVar6 * 3 + 1] =
               dVar5 * (pdVar4[lVar6 * 3 + 1] - pdVar4[(lVar6 + -1) * 3 + 1]);
          returnvalue[lVar6 * 3 + 2] =
               dVar5 * (pdVar4[lVar6 * 3 + 2] - pdVar4[(lVar6 + -1) * 3 + 2]);
        }
      }
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int fs(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata      = (UserData)user_data; /* access problem data    */
  sunindextype N      = udata->N;            /* set variable shortcuts */
  sunrealtype c       = udata->c;
  sunrealtype dx      = udata->dx;
  sunrealtype* Ydata  = NULL;
  sunrealtype* dYdata = NULL;
  sunrealtype tmp;
  sunindextype i;

  /* access data arrays */
  Ydata = N_VGetArrayPointer(y);
  if (check_retval((void*)Ydata, "N_VGetArrayPointer", 0)) { return 1; }

  dYdata = N_VGetArrayPointer(ydot);
  if (check_retval((void*)dYdata, "N_VGetArrayPointer", 0)) { return 1; }

  /* iterate over domain, computing advection */
  tmp = -c / dx;

  if (c > ZERO)
  {
    /*
     * right moving flow
     */

    /* left boundary Jacobian entries */
    dYdata[IDX(0, 0)] = tmp * (Ydata[IDX(0, 0)] - Ydata[IDX(N - 1, 0)]);
    dYdata[IDX(0, 1)] = tmp * (Ydata[IDX(0, 1)] - Ydata[IDX(N - 1, 1)]);
    dYdata[IDX(0, 2)] = tmp * (Ydata[IDX(0, 2)] - Ydata[IDX(N - 1, 2)]);

    /* interior Jacobian entries */
    for (i = 1; i < N; i++)
    {
      dYdata[IDX(i, 0)] = tmp * (Ydata[IDX(i, 0)] - Ydata[IDX(i - 1, 0)]);
      dYdata[IDX(i, 1)] = tmp * (Ydata[IDX(i, 1)] - Ydata[IDX(i - 1, 1)]);
      dYdata[IDX(i, 2)] = tmp * (Ydata[IDX(i, 2)] - Ydata[IDX(i - 1, 2)]);
    }
  }
  else if (c < ZERO)
  {
    /*
     * left moving flow
     */

    /* interior Jacobian entries */
    for (i = 0; i < N - 1; i++)
    {
      dYdata[IDX(i, 0)] = tmp * (Ydata[IDX(i + 1, 0)] - Ydata[IDX(i, 0)]);
      dYdata[IDX(i, 1)] = tmp * (Ydata[IDX(i + 1, 1)] - Ydata[IDX(i, 1)]);
      dYdata[IDX(i, 2)] = tmp * (Ydata[IDX(i + 1, 2)] - Ydata[IDX(i, 2)]);
    }

    /* right boundary Jacobian entries */
    dYdata[IDX(N - 1, 0)] = tmp * (Ydata[IDX(N - 1, 0)] - Ydata[IDX(0, 0)]);
    dYdata[IDX(N - 1, 1)] = tmp * (Ydata[IDX(N - 1, 1)] - Ydata[IDX(0, 1)]);
    dYdata[IDX(N - 1, 2)] = tmp * (Ydata[IDX(N - 1, 2)] - Ydata[IDX(0, 2)]);
  }

  /* return success */
  return (0);
}